

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_bind_syntax(sexp ls,sexp eval_ctx,sexp bind_ctx,int localp)

{
  int iVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp mac;
  sexp name;
  sexp res;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  sexp in_stack_ffffffffffffff88;
  sexp in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar2;
  sexp ctx;
  sexp ctx_00;
  sexp local_50;
  undefined1 local_48 [32];
  undefined8 env;
  undefined4 in_stack_ffffffffffffffe0;
  
  env = &DAT_0000043e;
  local_48._16_8_ = &DAT_0000043e;
  memset(local_48,0,0x10);
  local_50 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffa0,0,0x10);
  local_48._0_8_ = local_48 + 0x10;
  local_48._8_8_ = (((sexp)in_RSI)->value).context.saves;
  (((sexp)in_RSI)->value).context.saves = (sexp_gc_var_t *)local_48;
  ctx = (sexp)&local_50;
  ctx_00 = (sexp)(((sexp)in_RSI)->value).context.saves;
  (((sexp)in_RSI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa0;
  while( true ) {
    uVar2 = false;
    if ((in_RDI & 3) == 0) {
      uVar2 = ((sexp)in_RDI)->tag == 6;
    }
    if ((bool)uVar2 == false) goto LAB_00153cb4;
    if ((((((((sexp)in_RDI)->value).stack.length & 3) != 0) ||
         (((((sexp)in_RDI)->value).type.name)->tag != 6)) ||
        (((((((sexp)in_RDI)->value).type.name)->value).string.offset & 3) != 0)) ||
       (((((((((sexp)in_RDI)->value).type.name)->value).type.cpl)->tag != 6 ||
         (iVar1 = sexp_idp(in_stack_ffffffffffffff80), iVar1 == 0)) ||
        ((((((((sexp)in_RDI)->value).type.name)->value).type.cpl)->value).type.cpl != (sexp)0x23e)))
       ) break;
    iVar1 = sexp_idp(in_stack_ffffffffffffff80);
    if (iVar1 == 0) {
      local_48._16_8_ =
           sexp_eval_op((sexp)in_RDI,(sexp)in_RSI,in_RDX,
                        (sexp)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(sexp)env);
    }
    else {
      local_48._16_8_ =
           sexp_env_ref(ctx,(sexp)CONCAT17(uVar2,in_stack_ffffffffffffff98),
                        in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    if (((local_48._16_8_ & 3) == 0) && (*(sexp_tag_t *)local_48._16_8_ == 0x14)) {
      local_48._16_8_ =
           sexp_make_macro(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80);
    }
    if ((((local_48._16_8_ & 3) != 0) || (*(sexp_tag_t *)local_48._16_8_ != 0x15)) &&
       (((local_48._16_8_ & 3) != 0 || (*(sexp_tag_t *)local_48._16_8_ != 0x19)))) {
      if (((local_48._16_8_ & 3) != 0) ||
         (env = local_48._16_8_, *(sexp_tag_t *)local_48._16_8_ != 0x13)) {
        env = sexp_compile_error(unaff_retaddr,(char *)in_RDI,(sexp)in_RSI);
      }
LAB_00153cb4:
      (((sexp)in_RSI)->value).context.saves = (sexp_gc_var_t *)local_48._8_8_;
      return (sexp)env;
    }
    local_48._24_8_ = (((((sexp)in_RDI)->value).type.name)->value).type.name;
    if ((((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0x16)) &&
       ((((((sexp)in_RDX)->value).type.cpl)->value).type.name == (sexp)0x0)) {
      local_48._24_8_ = (((sexp)local_48._24_8_)->value).type.slots;
    }
    if ((((local_48._16_8_ & 3) == 0) && (*(sexp_tag_t *)local_48._16_8_ == 0x15)) &&
       ((((((((((sexp)in_RDI)->value).type.name)->value).type.cpl)->value).stack.length & 3) == 0 &&
        (((((((((sexp)in_RDI)->value).type.name)->value).type.cpl)->value).type.name)->tag == 6))))
    {
      (((anon_union_24768_35_b8e82fc1_for_value *)(local_48._16_8_ + 8))->type).slots =
           (((((((((sexp)in_RDI)->value).type.name)->value).type.cpl)->value).type.name)->value).
           type.slots;
    }
    if (in_ECX == 0) {
      sexp_env_define(ctx_00,ctx,(sexp)CONCAT17(uVar2,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90);
    }
    else {
      local_50 = sexp_cons_op((sexp)CONCAT17(uVar2,in_stack_ffffffffffffff98),
                              in_stack_ffffffffffffff90,(sexp_sint_t)in_stack_ffffffffffffff88,
                              in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      (local_50->value).type.slots = (((((sexp)in_RDX)->value).type.cpl)->value).type.slots;
      (((((sexp)in_RDX)->value).type.cpl)->value).type.slots = local_50;
    }
    in_RDI = (((sexp)in_RDI)->value).type.cpl;
  }
  env = sexp_compile_error(unaff_retaddr,(char *)in_RDI,(sexp)in_RSI);
  goto LAB_00153cb4;
}

Assistant:

static sexp analyze_bind_syntax (sexp ls, sexp eval_ctx, sexp bind_ctx, int localp) {
  sexp res = SEXP_VOID, name;
  sexp_gc_var2(mac, tmp);
  sexp_gc_preserve2(eval_ctx, mac, tmp);
  for ( ; sexp_pairp(ls); ls=sexp_cdr(ls)) {
    if (! (sexp_pairp(sexp_car(ls)) && sexp_pairp(sexp_cdar(ls))
           && sexp_idp(sexp_caar(ls)) && sexp_nullp(sexp_cddar(ls)))) {
      res = sexp_compile_error(eval_ctx, "bad syntax binding", sexp_pairp(ls) ? sexp_car(ls) : ls);
      break;
    }
    if (sexp_idp(sexp_cadar(ls)))
      mac = sexp_env_ref(eval_ctx, sexp_context_env(eval_ctx), sexp_cadar(ls), SEXP_FALSE);
    else
      mac = sexp_eval(eval_ctx, sexp_cadar(ls), NULL);
    if (sexp_procedurep(mac))
      mac = sexp_make_macro(eval_ctx, mac, sexp_context_env(eval_ctx));
    if (!(sexp_macrop(mac)||sexp_corep(mac))) {
      res = (sexp_exceptionp(mac) ? mac
             : sexp_compile_error(eval_ctx, "non-procedure macro", mac));
      break;
    }
    name = sexp_caar(ls);
    if (sexp_synclop(name) && sexp_env_global_p(sexp_context_env(bind_ctx)))
      name = sexp_synclo_expr(name);
    if (sexp_macrop(mac) && sexp_pairp(sexp_cadar(ls)))
      sexp_macro_source(mac) = sexp_pair_source(sexp_cadar(ls));
    if (localp)
      sexp_env_push(eval_ctx, sexp_context_env(bind_ctx), tmp, name, mac);
    else
      sexp_env_define(eval_ctx, sexp_context_env(bind_ctx), name, mac);
#if !SEXP_USE_STRICT_TOPLEVEL_BINDINGS
    if (localp)
      sexp_env_cell_syntactic_p(sexp_env_cell(eval_ctx, sexp_context_env(bind_ctx), name, 0)) = 1;
#endif
  }
  sexp_gc_release2(eval_ctx);
  return res;
}